

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNSum.cpp
# Opt level: O0

void __thiscall NaPNSum::action(NaPNSum *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  NaVector *pNVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  NaReal *pNVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  long in_RDI;
  double dVar8;
  uint i;
  uint in_stack_ffffffffffffff7c;
  NaVector *in_stack_ffffffffffffff80;
  NaPetriCnInput *in_stack_ffffffffffffff88;
  NaPetriCnInput *this_00;
  uint local_c;
  
  uVar4 = NaVector::dim((NaVector *)(in_RDI + 0x158));
  if ((uVar4 == 0) || (uVar4 = NaVector::dim((NaVector *)(in_RDI + 0x170)), uVar4 == 0)) {
    local_c = 0;
    while( true ) {
      pNVar6 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0xd8));
      uVar4 = (*pNVar6->_vptr_NaVector[6])();
      if (uVar4 <= local_c) break;
      pNVar6 = NaPetriCnInput::data(in_stack_ffffffffffffff88);
      iVar5 = (*pNVar6->_vptr_NaVector[8])(pNVar6,(ulong)local_c);
      dVar1 = *(double *)CONCAT44(extraout_var,iVar5);
      pNVar6 = NaPetriCnInput::data(in_stack_ffffffffffffff88);
      iVar5 = (*pNVar6->_vptr_NaVector[8])(pNVar6,(ulong)local_c);
      dVar8 = *(double *)CONCAT44(extraout_var_00,iVar5);
      pNVar6 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0xd8));
      iVar5 = (*pNVar6->_vptr_NaVector[8])(pNVar6,(ulong)local_c);
      *(double *)CONCAT44(extraout_var_01,iVar5) = dVar1 + dVar8;
      local_c = local_c + 1;
    }
  }
  else {
    uVar4 = NaVector::dim((NaVector *)(in_RDI + 0x158));
    if ((uVar4 == 1) || (uVar4 = NaVector::dim((NaVector *)(in_RDI + 0x170)), uVar4 == 1)) {
      local_c = 0;
      while( true ) {
        pNVar6 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0xd8));
        uVar4 = (*pNVar6->_vptr_NaVector[6])();
        if (uVar4 <= local_c) break;
        pNVar7 = NaVector::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        dVar1 = *pNVar7;
        pNVar6 = NaPetriCnInput::data(in_stack_ffffffffffffff88);
        iVar5 = (*pNVar6->_vptr_NaVector[8])(pNVar6,(ulong)local_c);
        dVar8 = *(double *)CONCAT44(extraout_var_02,iVar5);
        pNVar7 = NaVector::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        dVar2 = *pNVar7;
        pNVar6 = NaPetriCnInput::data(in_stack_ffffffffffffff88);
        iVar5 = (*pNVar6->_vptr_NaVector[8])(pNVar6,(ulong)local_c);
        dVar3 = *(double *)CONCAT44(extraout_var_03,iVar5);
        pNVar6 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0xd8));
        iVar5 = (*pNVar6->_vptr_NaVector[8])(pNVar6,(ulong)local_c);
        *(double *)CONCAT44(extraout_var_04,iVar5) = dVar1 * dVar8 + dVar2 * dVar3;
        local_c = local_c + 1;
      }
    }
    else {
      local_c = 0;
      while( true ) {
        pNVar6 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0xd8));
        uVar4 = (*pNVar6->_vptr_NaVector[6])();
        if (uVar4 <= local_c) break;
        pNVar7 = NaVector::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        this_00 = (NaPetriCnInput *)*pNVar7;
        pNVar6 = NaPetriCnInput::data(this_00);
        iVar5 = (*pNVar6->_vptr_NaVector[8])(pNVar6,(ulong)local_c);
        dVar1 = *(double *)CONCAT44(extraout_var_05,iVar5);
        pNVar7 = NaVector::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
        in_stack_ffffffffffffff80 = (NaVector *)*pNVar7;
        pNVar6 = NaPetriCnInput::data(this_00);
        iVar5 = (*pNVar6->_vptr_NaVector[8])(pNVar6,(ulong)local_c);
        dVar8 = (double)in_stack_ffffffffffffff80 * *(double *)CONCAT44(extraout_var_06,iVar5);
        pNVar6 = NaPetriCnOutput::data((NaPetriCnOutput *)(in_RDI + 0xd8));
        iVar5 = (*pNVar6->_vptr_NaVector[8])(pNVar6,(ulong)local_c);
        *(double *)CONCAT44(extraout_var_07,iVar5) = (double)this_00 * dVar1 + dVar8;
        local_c = local_c + 1;
      }
    }
  }
  return;
}

Assistant:

void
NaPNSum::action ()
{
    unsigned    i;

    if(0 == vMainGain.dim() || 0 == vAuxGain.dim())
      {
	/* vMainGain[i]=1 and vAuxGain[i]=1 by default */
	for(i = 0; i < sum.data().dim(); ++i)
	  sum.data()[i] = main.data()[i] + aux.data()[i];
      }
    else if(1 == vMainGain.dim() || 1 == vAuxGain.dim())
      {
	/* vMainGain[0]=k1 and vAuxGain[0]=k2 by default */
	for(i = 0; i < sum.data().dim(); ++i)
	  sum.data()[i] =
	    vMainGain[0] * main.data()[i]
	    + vAuxGain[0] * aux.data()[i];
      }
    else
      {
	for(i = 0; i < sum.data().dim(); ++i)
	  sum.data()[i] =
	    vMainGain[i] * main.data()[i]
	    + vAuxGain[i] * aux.data()[i];
      }
}